

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

StringPtrConvertResult
absl::lts_20240722::str_format_internal::FormatConvertImpl
          (wchar_t *v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  FormatConversionSpecImpl conv_00;
  FormatSinkImpl *__first;
  FormatConversionChar FVar1;
  ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144> AVar2;
  int iVar3;
  wchar_t *pwVar4;
  FormatSinkImpl *in_R9;
  FormatConversionSpecImpl conv_01;
  wchar_t local_74;
  wchar_t *local_70;
  size_t len;
  undefined1 local_5c [16];
  undefined1 local_4c [4];
  VoidPtr local_48 [2];
  FormatSinkImpl *local_38;
  FormatSinkImpl *sink_local;
  wchar_t *v_local;
  int local_20;
  wchar_t *local_18;
  FormatConversionSpecImpl conv_local;
  
  local_20 = conv.precision_;
  v_local = conv._0_8_;
  local_38 = sink;
  sink_local = (FormatSinkImpl *)v;
  local_18 = v_local;
  conv_local._0_4_ = local_20;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_18);
  if (FVar1 == 0x11) {
    VoidPtr::VoidPtr<const_wchar_t,_0UL>(local_48,(wchar_t *)sink_local);
    local_5c._8_8_ = local_18;
    local_4c[0] = conv_local.conv_;
    local_4c[1] = conv_local.flags_;
    local_4c[2] = conv_local.length_mod_;
    local_4c[3] = conv_local._3_1_;
    stack0xffffffffffffff9c = local_18;
    local_5c[0] = conv_local.conv_;
    local_5c[1] = conv_local.flags_;
    local_5c[2] = conv_local.length_mod_;
    local_5c[3] = conv_local._3_1_;
    conv_00.precision_._0_1_ = conv_local.conv_;
    conv_00.precision_._1_1_ = conv_local.flags_;
    conv_00.precision_._2_1_ = conv_local.length_mod_;
    conv_00.precision_._3_1_ = conv_local._3_1_;
    conv_00._0_8_ = local_18;
    AVar2 = FormatConvertImpl(local_48[0],conv_00,local_38);
    conv_local.width_._3_1_ = (bool)(AVar2.value & 1);
  }
  else {
    if (sink_local == (FormatSinkImpl *)0x0) {
      local_70 = (wchar_t *)0x0;
    }
    else {
      iVar3 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)&local_18);
      __first = sink_local;
      if (iVar3 < 0) {
        local_70 = (wchar_t *)wcslen((wchar_t *)sink_local);
      }
      else {
        iVar3 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)&local_18);
        local_74 = L'\0';
        pwVar4 = std::find<wchar_t_const*,wchar_t>
                           ((wchar_t *)__first,(wchar_t *)(__first->buf_ + (long)iVar3 * 4 + -0x20),
                            &local_74);
        local_70 = (wchar_t *)((long)pwVar4 - (long)sink_local >> 2);
      }
    }
    conv_01.width_ = 0;
    conv_01.conv_ = conv_local.conv_;
    conv_01.flags_ = conv_local.flags_;
    conv_01.length_mod_ = conv_local.length_mod_;
    conv_01._3_1_ = conv_local._3_1_;
    conv_01.precision_ = (int)local_38;
    conv_local.width_._3_1_ =
         anon_unknown_53::ConvertStringArg
                   ((anon_unknown_53 *)sink_local,local_70,(size_t)local_18,conv_01,in_R9);
  }
  return (StringPtrConvertResult)conv_local.width_._3_1_;
}

Assistant:

StringPtrConvertResult FormatConvertImpl(const wchar_t* v,
                                         const FormatConversionSpecImpl conv,
                                         FormatSinkImpl* sink) {
  if (conv.conversion_char() == FormatConversionCharInternal::p) {
    return {FormatConvertImpl(VoidPtr(v), conv, sink).value};
  }
  size_t len;
  if (v == nullptr) {
    len = 0;
  } else if (conv.precision() < 0) {
    len = std::wcslen(v);
  } else {
    // If precision is set, we look for the NUL-terminator on the valid range.
    len = static_cast<size_t>(std::find(v, v + conv.precision(), L'\0') - v);
  }
  return {ConvertStringArg(v, len, conv, sink)};
}